

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

BtorSimBitVector * btorsim_bv_add(BtorSimBitVector *a,BtorSimBitVector *b)

{
  uint bw;
  ulong uVar1;
  BtorSimBitVector *pBVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  bw = a->width;
  if (bw < 0x41) {
    uVar4 = a->len;
    uVar3 = (ulong)uVar4;
    if (uVar3 == 0) {
      uVar1 = 0;
    }
    else {
      lVar6 = 0;
      uVar1 = 0;
      do {
        uVar4 = uVar4 - 1;
        uVar1 = uVar1 | (ulong)*(uint *)((long)&a[1].width + lVar6) << ((char)uVar4 * ' ' & 0x3fU);
        lVar6 = lVar6 + 4;
      } while (uVar3 << 2 != lVar6);
    }
    uVar4 = b->len;
    uVar3 = (ulong)uVar4;
    if (uVar3 == 0) {
      uVar5 = 0;
    }
    else {
      lVar6 = 0;
      uVar5 = 0;
      do {
        uVar4 = uVar4 - 1;
        uVar5 = uVar5 | (ulong)*(uint *)((long)&b[1].width + lVar6) << ((char)uVar4 * ' ' & 0x3fU);
        lVar6 = lVar6 + 4;
      } while (uVar3 << 2 != lVar6);
    }
    pBVar2 = btorsim_bv_uint64_to_bv(uVar5 + uVar1,bw);
  }
  else {
    pBVar2 = btorsim_bv_new(bw);
    lVar6 = (ulong)(a->len - 1) + 2;
    uVar3 = 0;
    do {
      uVar3 = (ulong)(&b->width)[lVar6] + (&a->width)[lVar6] + uVar3;
      (&pBVar2->width)[lVar6] = (uint32_t)uVar3;
      uVar3 = uVar3 >> 0x20;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 1);
  }
  if ((ulong)pBVar2->len << 5 != (ulong)pBVar2->width) {
    pBVar2[1].width = pBVar2[1].width & 0x7fffffffU >> (~(byte)pBVar2->width & 0x1f);
  }
  return pBVar2;
}

Assistant:

BtorSimBitVector *
btorsim_bv_add (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  int64_t i;
  uint64_t x, y, sum;
  BtorSimBitVector *res;
  BTORSIM_BV_TYPE carry;

  if (a->width <= 64)
  {
    x   = btorsim_bv_to_uint64 (a);
    y   = btorsim_bv_to_uint64 (b);
    res = btorsim_bv_uint64_to_bv (x + y, a->width);
  }
  else
  {
    res   = btorsim_bv_new (a->width);
    carry = 0;
    for (i = a->len - 1; i >= 0; i--)
    {
      sum          = (uint64_t) a->bits[i] + b->bits[i] + carry;
      res->bits[i] = (BTORSIM_BV_TYPE) sum;
      carry        = (BTORSIM_BV_TYPE) (sum >> 32);
    }
  }

  set_rem_bits_to_zero (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}